

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

Layer * __thiscall ncnn::Net::create_custom_layer(Net *this,char *type)

{
  int iVar1;
  char *in_RDI;
  int index;
  Net *in_stack_fffffffffffffff8;
  Layer *pLVar2;
  
  iVar1 = custom_layer_to_index(in_stack_fffffffffffffff8,in_RDI);
  if (iVar1 == -1) {
    pLVar2 = (Layer *)0x0;
  }
  else {
    pLVar2 = create_custom_layer(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
  }
  return pLVar2;
}

Assistant:

Layer* Net::create_custom_layer(const char* type)
{
    int index = custom_layer_to_index(type);
    if (index == -1)
        return 0;

    return create_custom_layer(index);
}